

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmisaac.cpp
# Opt level: O1

size_t isaac_get_state(isaacctx *ctx,char *buf)

{
  uint32_t tmp;
  long lVar1;
  uint32_t tmp_4;
  
  if (buf != (char *)0x0) {
    *(uint32_t *)buf = ctx->cnt;
    *(uint32_t *)(buf + 4) = ctx->a;
    *(uint32_t *)(buf + 8) = ctx->b;
    *(uint32_t *)(buf + 0xc) = ctx->c;
    lVar1 = 0;
    do {
      *(uint32_t *)(buf + lVar1 * 8 + 0x10) = ctx->rsl[lVar1];
      *(uint32_t *)(buf + lVar1 * 8 + 0x14) = ctx->mem[lVar1];
      lVar1 = lVar1 + 1;
    } while (lVar1 != 0x100);
  }
  return 0x810;
}

Assistant:

size_t isaac_get_state(isaacctx *ctx, char *buf)
{
    /* if the didn't provide a buffer, it's a size-needed query */
    const size_t sz = 4 * (4 + ISAAC_RANDSIZ + ISAAC_RANDSIZ);
    if (buf == 0)
        return sz;

    /* copy the scalar members */
    oswp4(buf, ctx->cnt); buf += 4;
    oswp4(buf, ctx->a);   buf += 4;
    oswp4(buf, ctx->b);   buf += 4;
    oswp4(buf, ctx->c);   buf += 4;

    /* copy the array members */
    for (int i = 0 ; i < ISAAC_RANDSIZ ; ++i, buf += 8)
    {
        oswp4(buf, ctx->rsl[i]);
        oswp4(buf+4, ctx->mem[i]);
    }

    return sz;
}